

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.h
# Opt level: O2

int hydro_sign_final_verify(hydro_sign_state *state,uint8_t *csig,uint8_t *pk)

{
  uint uVar1;
  uint uVar2;
  hydro_x25519_limb_t local_1a0;
  uint8_t challenge [32];
  hydro_x25519_limb_t local_178;
  hydro_x25519_limb_t hStack_170;
  hydro_x25519_limb_t hStack_168;
  hydro_x25519_limb_t hStack_160;
  hydro_x25519_limb_t hStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  hydro_x25519_limb_t local_138 [4];
  hydro_x25519_limb_t local_118 [4];
  hydro_x25519_limb_t local_f8;
  hydro_x25519_limb_t hStack_f0;
  hydro_x25519_limb_t hStack_e8;
  hydro_x25519_limb_t hStack_e0;
  hydro_x25519_limb_t hStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  hydro_x25519_fe xo2;
  uint8_t prehash [64];
  
  hydro_hash_final(&state->hash_st,prehash,0x40);
  hydro_sign_challenge(challenge,csig,pk,prehash);
  hydro_x25519_core((hydro_x25519_fe *)&local_178,challenge,pk,false);
  hydro_x25519_core(&local_138,csig + 0x20,"\t",false);
  local_1a0 = 0x10;
  xo2[0] = *(hydro_x25519_limb_t *)csig;
  xo2[1] = *(hydro_x25519_limb_t *)(csig + 8);
  xo2[2] = *(hydro_x25519_limb_t *)(csig + 0x10);
  xo2[3] = *(hydro_x25519_limb_t *)(csig + 0x18);
  local_f8 = local_178;
  hStack_f0 = hStack_170;
  hStack_e8 = hStack_168;
  hStack_e0 = hStack_160;
  hStack_d8 = hStack_158;
  uStack_d0 = uStack_150;
  uStack_c8 = uStack_148;
  uStack_c0 = uStack_140;
  hydro_x25519_ladder_part1(&local_138);
  hydro_x25519_mul1(local_118,&local_178);
  hydro_x25519_mul1(local_118,&hStack_158);
  hydro_x25519_mul1(local_118,xo2);
  hydro_x25519_mul(local_118,local_118,&local_1a0,1);
  hydro_x25519_mul1(&hStack_d8,xo2);
  hydro_x25519_sub(&hStack_d8,&hStack_d8,&local_f8);
  hydro_x25519_sqr1(&hStack_d8);
  hydro_x25519_sub(&hStack_d8,&hStack_d8,local_118);
  uVar1 = hydro_x25519_canon(local_118);
  uVar2 = hydro_x25519_canon(&hStack_d8);
  return ~uVar2 | uVar1;
}

Assistant:

int
hydro_sign_final_verify(hydro_sign_state *state, const uint8_t csig[hydro_sign_BYTES],
                        const uint8_t pk[hydro_sign_PUBLICKEYBYTES])
{
    uint8_t        challenge[hydro_sign_CHALLENGEBYTES];
    uint8_t        prehash[hydro_sign_PREHASHBYTES];
    const uint8_t *nonce = &csig[0];

    hydro_hash_final(&state->hash_st, prehash, sizeof prehash);
    hydro_sign_challenge(challenge, nonce, pk, prehash);

    return hydro_sign_verify_challenge(csig, challenge, pk);
}